

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-rinex.c
# Opt level: O0

int read_navigation_record_values(ingest_info *info,char *line,int num_values,double *value)

{
  int iVar1;
  long lVar2;
  int iVar3;
  long linelength;
  long expected_line_length;
  int index;
  int i;
  double *value_local;
  int num_values_local;
  char *line_local;
  ingest_info *info_local;
  
  expected_line_length._4_4_ = 0;
  do {
    if (num_values <= expected_line_length._4_4_) {
      return 0;
    }
    iVar3 = (expected_line_length._4_4_ + 1) % 4;
    if (iVar3 == 0) {
      linelength = 0x50;
      lVar2 = ftell((FILE *)info->f);
      info->offset = lVar2;
      info->linenumber = info->linenumber + 1;
      iVar1 = get_line(info->f,line);
      lVar2 = (long)iVar1;
      if (lVar2 < 0) {
        return -1;
      }
      if (num_values - expected_line_length._4_4_ < 4) {
        linelength = (long)(((num_values - expected_line_length._4_4_) % 4) * 0x13 + 4);
      }
      if (lVar2 < linelength) {
        coda_set_error(-0x16,"record line length (%ld) too short (line: %ld, byte offset: %ld)",
                       lVar2,info->linenumber,info->offset);
        return -1;
      }
    }
    lVar2 = coda_ascii_parse_double
                      (line + (iVar3 * 0x13 + 4),0x13,value + expected_line_length._4_4_,0);
    if (lVar2 < 0) {
      coda_add_error_message
                (" (line: %ld, byte offset: %ld)",info->linenumber,
                 info->offset + 4 + (long)(iVar3 * 0x13));
      return -1;
    }
    expected_line_length._4_4_ = expected_line_length._4_4_ + 1;
  } while( true );
}

Assistant:

static int read_navigation_record_values(ingest_info *info, char *line, int num_values, double *value)
{
    int i;

    for (i = 0; i < num_values; i++)
    {
        int index = (i + 1) % 4;

        if (index == 0)
        {
            long expected_line_length = 4 + 4 * 19;
            long linelength;

            /* read next line */
            info->offset = ftell(info->f);
            info->linenumber++;
            linelength = get_line(info->f, line);
            if (linelength < 0)
            {
                return -1;
            }
            if (num_values - i < 4)
            {
                expected_line_length = 4 + ((num_values - i) % 4) * 19;
            }
            if (linelength < expected_line_length)
            {
                coda_set_error(CODA_ERROR_FILE_READ, "record line length (%ld) too short (line: %ld, byte offset: %ld)",
                               linelength, info->linenumber, info->offset);
                return -1;
            }
        }
        if (coda_ascii_parse_double(&line[4 + index * 19], 19, &value[i], 0) < 0)
        {
            coda_add_error_message(" (line: %ld, byte offset: %ld)", info->linenumber, info->offset + 4 + index * 19);
            return -1;
        }
    }

    return 0;
}